

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_types.hpp
# Opt level: O1

uint64_t __thiscall
pstore::index::fnv_64a_hash_indirect_string::operator()
          (fnv_64a_hash_indirect_string *this,indirect_string *indir)

{
  uint64_t uVar1;
  shared_sstring_view owner;
  fnv_64a_hash local_49;
  sstring_view<std::shared_ptr<const_char>_> local_48;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_28;
  raw_sstring_view local_20;
  
  local_28.ptr_ = &local_48;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.size_ = 0;
  gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant(&local_28);
  local_20 = indirect_string::as_string_view(indir,local_28);
  uVar1 = fnv_64a_hash::operator()(&local_49,&local_20);
  if (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return uVar1;
}

Assistant:

std::uint64_t operator() (indirect_string const & indir) const {
                shared_sstring_view owner;
                return fnv_64a_hash () (indir.as_string_view (&owner));
            }